

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O0

int mem_create(char *filename,int *handle)

{
  size_t in_RSI;
  int status;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 local_4;
  
  local_4 = mem_createmem(in_RSI,(int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0
                                                ));
  if (local_4 == 0) {
    local_4 = 0;
  }
  else {
    ffpmsg((char *)0x11dc64);
  }
  return local_4;
}

Assistant:

int mem_create(char *filename, int *handle)
/*
  Create a new empty memory file for subsequent writes.
  The file name is ignored in this case.
*/
{
    int status;

    /* initially allocate 1 FITS block = 2880 bytes */
    status = mem_createmem(2880L, handle);

    if (status)
    {
        ffpmsg("failed to create empty memory file (mem_create)");
        return(status);
    }

    return(0);
}